

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ServiceGenerator::GenerateNewReflectiveBlockingServiceMethod
          (ServiceGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Indent();
  google::protobuf::io::Printer::Indent();
  GenerateGetDescriptorForType(this,printer);
  GenerateCallBlockingMethod(this,printer);
  GenerateGetPrototype(this,REQUEST,printer);
  GenerateGetPrototype(this,RESPONSE,printer);
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Print((char *)printer);
  return;
}

Assistant:

void ServiceGenerator::GenerateNewReflectiveBlockingServiceMethod(
    io::Printer* printer) {
  printer->Print(
    "public static com.google.protobuf.BlockingService\n"
    "    newReflectiveBlockingService(final BlockingInterface impl) {\n"
    "  return new com.google.protobuf.BlockingService() {\n");
  printer->Indent();
  printer->Indent();

  GenerateGetDescriptorForType(printer);

  GenerateCallBlockingMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);

  printer->Outdent();
  printer->Print("};\n");
  printer->Outdent();
  printer->Print("}\n\n");
}